

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O1

void __thiscall
FileTest_Write_and_Read_Data_Test::~FileTest_Write_and_Read_Data_Test
          (FileTest_Write_and_Read_Data_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileTest, Write_and_Read_Data) {
#ifndef _MSC_VER
  std::string filename = "/tmp/test";
#else
  std::string filename = "../../test";
#endif
  FILE* file_w = OpenFileOrDie(filename.c_str(), "w");
  int number = 999;
  WriteDataToDisk(file_w, (char*)&number, sizeof(number));
  Close(file_w);
  int read = 0;
  FILE* file_r = OpenFileOrDie(filename.c_str(), "r");
  ReadDataFromDisk(file_r, (char*)&read, sizeof(read));
  EXPECT_EQ(read, number);
  Close(file_r);
  RemoveFile(filename.c_str());
}